

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

void slang::ast::addBlockMembers(GenerateBlockSymbol *block,SyntaxNode *syntax)

{
  size_type sVar1;
  pointer ppMVar2;
  GenerateBlockSyntax *pGVar3;
  long lVar4;
  
  if (syntax->kind == GenerateBlock) {
    pGVar3 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(syntax);
    sVar1 = (pGVar3->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            size_;
    if (sVar1 != 0) {
      ppMVar2 = (pGVar3->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
                data_;
      lVar4 = 0;
      do {
        Scope::addMembers(&block->super_Scope,*(SyntaxNode **)((long)ppMVar2 + lVar4));
        lVar4 = lVar4 + 8;
      } while (sVar1 << 3 != lVar4);
    }
    return;
  }
  Scope::addMembers(&block->super_Scope,syntax);
  return;
}

Assistant:

static void addBlockMembers(GenerateBlockSymbol& block, const SyntaxNode& syntax) {
    if (syntax.kind != SyntaxKind::GenerateBlock) {
        block.addMembers(syntax);
    }
    else {
        for (auto member : syntax.as<GenerateBlockSyntax>().members)
            block.addMembers(*member);
    }
}